

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void free_D_ParseNode(D_Parser *p,D_ParseNode *dpn)

{
  int *piVar1;
  PNode *pn;
  
  if (dpn != (D_ParseNode *)0x1) {
    piVar1 = (int *)((long)&dpn[-2].start_loc.pathname + 4);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      pn = (PNode *)(dpn + -2);
      if (dpn == (D_ParseNode *)0x0) {
        pn = (PNode *)0x0;
      }
      free_PNode((Parser *)p,pn);
    }
    free_parser_working_data((Parser *)p);
    return;
  }
  return;
}

Assistant:

void free_D_ParseNode(D_Parser *p, D_ParseNode *dpn) {
  if (dpn != NO_DPN) {
    unref_pn((Parser *)p, DPN_TO_PN(dpn));
    free_parser_working_data((Parser *)p);
  }
#ifdef TRACK_PNODES
  if (((Parser *)p)->xall) printf("tracked pnodes\n");
#endif
}